

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::Totals::operator-(Totals *__return_storage_ptr__,Totals *this,Totals *other)

{
  Totals *diff;
  Counts local_48;
  Counts local_30;
  Totals *local_18;
  Totals *other_local;
  Totals *this_local;
  
  local_18 = other;
  other_local = this;
  Totals(__return_storage_ptr__);
  Counts::operator-(&local_30,&this->assertions,&local_18->assertions);
  (__return_storage_ptr__->assertions).passed = local_30.passed;
  (__return_storage_ptr__->assertions).failed = local_30.failed;
  (__return_storage_ptr__->assertions).failedButOk = local_30.failedButOk;
  Counts::operator-(&local_48,&this->testCases,&local_18->testCases);
  (__return_storage_ptr__->testCases).passed = local_48.passed;
  (__return_storage_ptr__->testCases).failed = local_48.failed;
  (__return_storage_ptr__->testCases).failedButOk = local_48.failedButOk;
  return __return_storage_ptr__;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }